

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

uint __thiscall wasm::Type::getByteSize(Type *this)

{
  size_t sVar1;
  int iVar2;
  BasicType BVar3;
  Type *pTVar4;
  Type in_RSI;
  uint uVar5;
  Type *pTVar6;
  Iterator IVar7;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  if ((this->id & 1) != 0 && 6 < this->id) {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48 = (undefined1  [8])this;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)this;
    IVar7 = end(this);
    sVar1 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    uVar5 = 0;
    pTVar4 = (Type *)0x1;
    while (pTVar6 = pTVar4,
          (long)pTVar6 -
          IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 1 ||
          IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
          (Type *)sVar1) {
      pTVar4 = Iterator::operator*((Iterator *)local_48);
      iVar2 = getByteSize::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pTVar4->id,in_RSI);
      uVar5 = uVar5 + iVar2;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar6;
      pTVar4 = (Type *)((long)&pTVar6->id + 1);
    }
    return uVar5;
  }
  BVar3 = getBasic((Type *)&stack0xfffffffffffffff0);
  if (BVar3 - i32 < 5) {
    return *(uint *)(&DAT_00e5b778 + (ulong)(BVar3 - i32) * 4);
  }
  handle_unreachable("invalid type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                     ,0x29a);
}

Assistant:

unsigned Type::getByteSize() const {
  // TODO: alignment?
  auto getSingleByteSize = [](Type t) {
    switch (t.getBasic()) {
      case Type::i32:
      case Type::f32:
        return 4;
      case Type::i64:
      case Type::f64:
        return 8;
      case Type::v128:
        return 16;
      case Type::none:
      case Type::unreachable:
        break;
    }
    WASM_UNREACHABLE("invalid type");
  };

  if (isTuple()) {
    unsigned size = 0;
    for (const auto& t : *this) {
      size += getSingleByteSize(t);
    }
    return size;
  }
  return getSingleByteSize(*this);
}